

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O0

void __thiscall
pstore::region::region_builder<pstore::file::in_memory,_pstore::in_memory_mapper>::
check_regions_are_contiguous
          (region_builder<pstore::file::in_memory,_pstore::in_memory_mapper> *this,
          container_type *regions)

{
  bool bVar1;
  __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00
  ;
  element_type *peVar2;
  container_type *pcVar3;
  uint64_t uVar4;
  memory_mapper_ptr *region;
  const_iterator __end2;
  const_iterator __begin2;
  container_type *__range2;
  uint64_t p;
  container_type *regions_local;
  region_builder<pstore::file::in_memory,_pstore::in_memory_mapper> *this_local;
  
  __range2 = (container_type *)0x0;
  __end2 = std::
           vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
           ::begin(regions);
  region = (memory_mapper_ptr *)
           std::
           vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
           ::end(regions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::shared_ptr<pstore::memory_mapper_base>_*,_std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_>
                                *)&region);
    if (!bVar1) {
      return;
    }
    this_00 = (__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<const_std::shared_ptr<pstore::memory_mapper_base>_*,_std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_>
                 ::operator*(&__end2);
    peVar2 = std::
             __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    pcVar3 = (container_type *)memory_mapper_base::offset(peVar2);
    if (pcVar3 != __range2) break;
    peVar2 = std::
             __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    uVar4 = memory_mapper_base::size(peVar2);
    __range2 = (container_type *)
               ((long)&(__range2->
                       super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar4);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<pstore::memory_mapper_base>_*,_std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_>
    ::operator++(&__end2);
  }
  assert_failed("region->offset () == p",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                ,0xb4);
}

Assistant:

void region_builder<File, MemoryMapper>::check_regions_are_contiguous (
            container_type const & regions) {
#ifdef NDEBUG
            (void) regions;
#else
            // Check that the regions are contiguous and sorted.
            std::uint64_t p = 0;
            for (pstore::region::memory_mapper_ptr const & region : regions) {
                PSTORE_ASSERT (region->offset () == p);
                p += region->size ();
            }
#endif
        }